

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode set_reader(Curl_easy *data,Curl_HttpReq httpreq)

{
  char *headerline;
  size_t local_50;
  CURLcode local_40;
  char *ptr;
  _Bool chunked;
  curl_off_t postsize;
  CURLcode result;
  Curl_HttpReq httpreq_local;
  Curl_easy *data_local;
  
  local_50 = (data->state).infilesize;
  if ((*(uint *)&(data->req).field_0xd1 >> 0x12 & 1) == 0) {
    if (httpreq == HTTPREQ_POST) {
      if (local_50 == 0) {
        postsize._0_4_ = Curl_creader_set_null(data);
      }
      else if ((data->set).postfields == (void *)0x0) {
        ptr._7_1_ = false;
        headerline = Curl_checkheaders(data,"Transfer-Encoding",0x11);
        if (headerline != (char *)0x0) {
          ptr._7_1_ = Curl_compareheader(headerline,"Transfer-Encoding:",0x12,"chunked",7);
        }
        if (ptr._7_1_ != false) {
          local_50 = 0xffffffffffffffff;
        }
        postsize._0_4_ = Curl_creader_set_fread(data,local_50);
      }
      else if ((long)local_50 < 1) {
        postsize._0_4_ = Curl_creader_set_null(data);
      }
      else {
        postsize._0_4_ = Curl_creader_set_buf(data,(char *)(data->set).postfields,local_50);
      }
      data_local._4_4_ = (CURLcode)postsize;
    }
    else if (httpreq - HTTPREQ_POST_FORM < 2) {
      data_local._4_4_ = set_post_reader(data,httpreq);
    }
    else if (httpreq == HTTPREQ_PUT) {
      if (local_50 == 0) {
        local_40 = Curl_creader_set_null(data);
      }
      else {
        local_40 = Curl_creader_set_fread(data,local_50);
      }
      data_local._4_4_ = local_40;
    }
    else {
      (data->state).infilesize = 0;
      data_local._4_4_ = Curl_creader_set_null(data);
    }
  }
  else {
    data_local._4_4_ = Curl_creader_set_null(data);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode set_reader(struct Curl_easy *data, Curl_HttpReq httpreq)
{
  CURLcode result = CURLE_OK;
  curl_off_t postsize = data->state.infilesize;

  DEBUGASSERT(data->conn);

  if(data->req.authneg) {
    return Curl_creader_set_null(data);
  }

  switch(httpreq) {
  case HTTPREQ_PUT: /* Let's PUT the data to the server! */
    return postsize ? Curl_creader_set_fread(data, postsize) :
      Curl_creader_set_null(data);

#if !defined(CURL_DISABLE_MIME) || !defined(CURL_DISABLE_FORM_API)
  case HTTPREQ_POST_FORM:
  case HTTPREQ_POST_MIME:
    return set_post_reader(data, httpreq);
#endif

  case HTTPREQ_POST:
    /* this is the simple POST, using x-www-form-urlencoded style */
    /* the size of the post body */
    if(!postsize) {
      result = Curl_creader_set_null(data);
    }
    else if(data->set.postfields) {
      if(postsize > 0)
        result = Curl_creader_set_buf(data, data->set.postfields,
                                      (size_t)postsize);
      else
        result = Curl_creader_set_null(data);
    }
    else {
      /* we read the bytes from the callback. In case "chunked" encoding
       * is forced by the application, we disregard `postsize`. This is
       * a backward compatibility decision to earlier versions where
       * chunking disregarded this. See issue #13229. */
      bool chunked = FALSE;
      char *ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
      if(ptr) {
        /* Some kind of TE is requested, check if 'chunked' is chosen */
        chunked = Curl_compareheader(ptr, STRCONST("Transfer-Encoding:"),
                                     STRCONST("chunked"));
      }
      result = Curl_creader_set_fread(data, chunked ? -1 : postsize);
    }
    return result;

  default:
    /* HTTP GET/HEAD download, has no body, needs no Content-Length */
    data->state.infilesize = 0;
    return Curl_creader_set_null(data);
  }
  /* not reached */
}